

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

string * __thiscall
lest::make_tuple_string<std::tuple<char,int,double,char_const*>,2ul>::make_abi_cxx11_
          (string *__return_storage_ptr__,
          make_tuple_string<std::tuple<char,int,double,char_const*>,2ul> *this,
          tuple<char,_int,_double,_const_char_*> *tuple)

{
  uint *puVar1;
  ostream *poVar2;
  int value;
  tuple<char,_int,_double,_const_char_*> *tuple_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1b0;
  ostringstream local_190 [8];
  ostringstream os;
  tuple<char,_int,_double,_const_char_*> *tuple_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  puVar1 = (uint *)std::get<1ul,char,int,double,char_const*>
                             ((tuple<char,_int,_double,_const_char_*> *)this);
  to_string_abi_cxx11_(&local_1b0,(lest *)(ulong)*puVar1,value);
  poVar2 = std::operator<<((ostream *)local_190,(string *)&local_1b0);
  std::operator<<(poVar2,", ");
  std::__cxx11::string::~string((string *)&local_1b0);
  make_tuple_string<std::tuple<char,int,double,char_const*>,1ul>::make_abi_cxx11_
            (&local_1e0,(make_tuple_string<std::tuple<char,int,double,char_const*>,1ul> *)this,
             tuple_00);
  std::__cxx11::ostringstream::str();
  std::operator+(__return_storage_ptr__,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string make( TU const & tuple )
    {
        std::ostringstream os;
        os << to_string( std::get<N - 1>( tuple ) ) << ( N < std::tuple_size<TU>::value ? ", ": " ");
        return make_tuple_string<TU, N - 1>::make( tuple ) + os.str();
    }